

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_storage.c
# Opt level: O3

psa_status_t
psa_load_persistent_key(psa_core_key_attributes_t *attr,uint8_t **data,size_t *data_length)

{
  psa_status_t pVar1;
  psa_status_t pVar2;
  uint8_t *storage_data;
  ulong uid;
  ulong __size;
  psa_storage_info_t data_identifier_info;
  size_t data_length_1;
  psa_storage_info_t local_48;
  size_t *local_40;
  size_t local_38;
  
  uid = (ulong)attr->id;
  pVar1 = psa_its_get_info(uid,&local_48);
  if (pVar1 == 0) {
    __size = (ulong)local_48.size;
    local_40 = data_length;
    storage_data = (uint8_t *)calloc(1,__size);
    if (storage_data == (uint8_t *)0x0) {
      pVar1 = -0x8d;
    }
    else {
      local_38 = 0;
      pVar1 = psa_its_get_info(uid,&local_48);
      if (pVar1 == 0) {
        pVar2 = psa_its_get(uid,0,local_48.size,storage_data,&local_38);
        pVar1 = -0x92;
        if ((local_38 == __size) && (pVar1 = pVar2, pVar2 == 0)) {
          pVar1 = psa_parse_key_data_from_storage(storage_data,__size,data,local_40,attr);
        }
      }
      free(storage_data);
    }
  }
  return pVar1;
}

Assistant:

psa_status_t psa_load_persistent_key( psa_core_key_attributes_t *attr,
                                      uint8_t **data,
                                      size_t *data_length )
{
    psa_status_t status = PSA_SUCCESS;
    uint8_t *loaded_data;
    size_t storage_data_length = 0;
    psa_key_id_t key = attr->id;

    status = psa_crypto_storage_get_data_length( key, &storage_data_length );
    if( status != PSA_SUCCESS )
        return( status );

    loaded_data = mbedtls_calloc( 1, storage_data_length );

    if( loaded_data == NULL )
        return( PSA_ERROR_INSUFFICIENT_MEMORY );

    status = psa_crypto_storage_load( key, loaded_data, storage_data_length );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_parse_key_data_from_storage( loaded_data, storage_data_length,
                                              data, data_length, attr );

exit:
    mbedtls_free( loaded_data );
    return( status );
}